

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapProxyInfo(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  SnapProxyInfo *pSVar2;
  RecyclableObject *pRVar3;
  RecyclableObject *target;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapProxyInfo*,(TTD::NSSnapObjects::SnapObjectType)27>
                     (snpObject);
  if (pSVar2->HandlerId == 0) {
    pRVar3 = (RecyclableObject *)0x0;
  }
  else {
    pRVar3 = InflateMap::LookupObject(inflator,pSVar2->HandlerId);
  }
  if (pSVar2->TargetId == 0) {
    target = (RecyclableObject *)0x0;
  }
  else {
    target = InflateMap::LookupObject(inflator,pSVar2->TargetId);
  }
  pRVar3 = Js::JavascriptLibrary::CreateProxy_TTD
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,pRVar3,target);
  return pRVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapProxyInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            SnapProxyInfo* proxyInfo = SnapObjectGetAddtlInfoAs<SnapProxyInfo*, SnapObjectType::SnapProxyObject>(snpObject);

            Js::RecyclableObject* handlerObj = (proxyInfo->HandlerId != TTD_INVALID_PTR_ID) ? inflator->LookupObject(proxyInfo->HandlerId) : nullptr;
            Js::RecyclableObject* targetObj = (proxyInfo->TargetId != TTD_INVALID_PTR_ID) ? inflator->LookupObject(proxyInfo->TargetId) : nullptr;

            return  ctx->GetLibrary()->CreateProxy_TTD(handlerObj, targetObj);
        }